

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeTags(Module *this,function<bool_(wasm::Tag_*)> *pred)

{
  function<bool_(wasm::Tag_*)> local_38;
  function<bool_(wasm::Tag_*)> *local_18;
  function<bool_(wasm::Tag_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Tag_*)> *)this;
  std::function<bool_(wasm::Tag_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>,std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>,wasm::Tag>
            (&this->tags,&this->tagsMap,&local_38);
  std::function<bool_(wasm::Tag_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeTags(std::function<bool(Tag*)> pred) {
  removeModuleElements(tags, tagsMap, pred);
}